

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDGrammar.hpp
# Opt level: O0

XMLSize_t __thiscall
xercesc_4_0::DTDGrammar::getElemId
          (DTDGrammar *this,uint param_1,XMLCh *param_2,XMLCh *qName,uint param_4)

{
  DTDElementDecl *this_00;
  DTDElementDecl *decl;
  uint param_4_local;
  XMLCh *qName_local;
  XMLCh *param_2_local;
  uint param_1_local;
  DTDGrammar *this_local;
  
  this_00 = NameIdPool<xercesc_4_0::DTDElementDecl>::getByKey(this->fElemDeclPool,qName);
  if (this_00 == (DTDElementDecl *)0x0) {
    this_local = (DTDGrammar *)0xfffffffe;
  }
  else {
    this_local = (DTDGrammar *)XMLElementDecl::getId(&this_00->super_XMLElementDecl);
  }
  return (XMLSize_t)this_local;
}

Assistant:

inline XMLSize_t DTDGrammar::getElemId (const   unsigned int
                                              , const XMLCh* const
                                              , const XMLCh* const    qName
                                              , unsigned int) const
{
    //
    //  In this case, we don't return zero to mean 'not found', so we have to
    //  map it to the official not found value if we don't find it.
    //
    const DTDElementDecl* decl = fElemDeclPool->getByKey(qName);
    if (!decl)
        return XMLElementDecl::fgInvalidElemId;
    return decl->getId();
}